

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMFPlay.cpp
# Opt level: O2

void __thiscall dsa::CSMFPlay::Start(CSMFPlay *this,bool reset)

{
  ushort uVar1;
  pointer piVar2;
  pointer pCVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  CMIDIModule *this_00;
  int i;
  long lVar5;
  CSMFEvent local_50;
  
  if ((int)CONCAT71(in_register_00000031,reset) != 0) {
    this_00 = (CMIDIModule *)&this->field_0x30;
    for (lVar5 = 0; lVar5 < this->m_mods; lVar5 = lVar5 + 1) {
      CMIDIModule::Reset(this_00);
      this_00 = this_00 + 1;
    }
  }
  this->m_tempo = 500000;
  this->m_time_rest = 0.0;
  this->rendered_ticks = 0;
  this->wanted_ticks = 0;
  piVar2 = (this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  (this->m_end_flag).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (this->m_end_flag).super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  (this->m_end_flag).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  pCVar3 = (this->m_event).super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_event).super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar3) {
    (this->m_event).super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar3;
  }
  uVar1 = (this->m_smf).m_track_num;
  this->m_playing_tracks = (uint)uVar1;
  lVar5 = 0;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    *(undefined8 *)((long)(this->m_smf).m_MTrk_ptr + lVar5) = 0;
    local_50.m_delta._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->m_delta,(int *)&local_50);
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->m_end_flag,false);
    CSMF::ReadNextEvent(&local_50,&this->m_smf,(int)uVar4);
    std::vector<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>::emplace_back<dsa::CSMFEvent>
              (&this->m_event,&local_50);
    (this->m_delta).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] =
         *(int *)((long)&((this->m_event).
                          super__Vector_base<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_delta + lVar5 * 4);
    uVar1 = (this->m_smf).m_track_num;
    lVar5 = lVar5 + 8;
  }
  return;
}

Assistant:

void CSMFPlay::Start(bool reset) {

  if (reset) for(int i=0;i<m_mods;i++) m_module[i].Reset();

  m_tempo = (60*1000000)/120;
  m_time_rest = 0.0;

  rendered_ticks = 0;
  wanted_ticks = 0;

  m_delta.clear();
  m_end_flag.clear();
  m_event.clear();

  m_playing_tracks = m_smf.m_track_num;

  for(int trk=0; trk<m_smf.m_track_num; trk++) {
    m_smf.Seek(trk,0);
    m_delta.push_back(0);
    m_end_flag.push_back(false);
    try {
      m_event.push_back(m_smf.ReadNextEvent(trk));
	  m_delta[trk] = m_event[trk].m_delta;
    } catch (CSMF_Exception) {
      m_end_flag[trk] = true;
    }
  }
}